

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::NormalizeBoneWeights
          (OgreBinarySerializer *this,VertexData *vertexData)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  pointer pVVar3;
  _Rb_tree_node_base *p_Var4;
  iterator __begin4;
  pointer pVVar5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  pointer pVVar6;
  const_iterator baEnd;
  const_iterator baIter;
  float fVar7;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> influencedVertices;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  _Stack_58;
  
  if (vertexData != (VertexData *)0x0) {
    pVVar5 = (vertexData->super_IVertexData).boneAssignments.
             super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar3 = (vertexData->super_IVertexData).boneAssignments.
             super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar5 != pVVar3) {
      p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      do {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&_Stack_58,&pVVar5->vertexIndex);
        pVVar5 = pVVar5 + 1;
        p_Var4 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
      } while (pVVar5 != pVVar3);
      for (; (_Rb_tree_header *)p_Var4 != p_Var1;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        pVVar5 = (vertexData->super_IVertexData).boneAssignments.
                 super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3 = (vertexData->super_IVertexData).boneAssignments.
                 super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pVVar5 != pVVar3) {
          _Var2 = p_Var4[1]._M_color;
          fVar7 = 0.0;
          pVVar6 = pVVar5;
          do {
            if (pVVar6->vertexIndex == _Var2) {
              fVar7 = fVar7 + pVVar6->weight;
            }
            pVVar6 = pVVar6 + 1;
          } while (pVVar6 != pVVar3);
          if ((fVar7 < 0.95 || 1.05 < fVar7) && pVVar5 != pVVar3) {
            do {
              if (pVVar5->vertexIndex == _Var2) {
                pVVar5->weight = pVVar5->weight / fVar7;
              }
              pVVar5 = pVVar5 + 1;
            } while (pVVar5 != pVVar3);
          }
        }
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&_Stack_58);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::NormalizeBoneWeights(VertexData *vertexData) const
{
    if (!vertexData || vertexData->boneAssignments.empty())
        return;

    std::set<uint32_t> influencedVertices;
    for (VertexBoneAssignmentList::const_iterator baIter=vertexData->boneAssignments.begin(), baEnd=vertexData->boneAssignments.end(); baIter != baEnd; ++baIter) {
        influencedVertices.insert(baIter->vertexIndex);
    }

    /** Normalize bone weights.
        Some exporters won't care if the sum of all bone weights
        for a single vertex equals 1 or not, so validate here. */
    const float epsilon = 0.05f;
    for (const uint32_t vertexIndex : influencedVertices)
    {
        float sum = 0.0f;
        for (VertexBoneAssignmentList::const_iterator baIter=vertexData->boneAssignments.begin(), baEnd=vertexData->boneAssignments.end(); baIter != baEnd; ++baIter)
        {
            if (baIter->vertexIndex == vertexIndex)
                sum += baIter->weight;
        }
        if ((sum < (1.0f - epsilon)) || (sum > (1.0f + epsilon)))
        {
            for (auto &boneAssign : vertexData->boneAssignments)
            {
                if (boneAssign.vertexIndex == vertexIndex)
                    boneAssign.weight /= sum;
            }
        }
    }
}